

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_noActualCallForOutputParameter_Test::
~TEST_MockParameterTest_noActualCallForOutputParameter_Test
          (TEST_MockParameterTest_noActualCallForOutputParameter_Test *this)

{
  TEST_MockParameterTest_noActualCallForOutputParameter_Test *this_local;
  
  ~TEST_MockParameterTest_noActualCallForOutputParameter_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockParameterTest, noActualCallForOutputParameter)
{
    MockFailureReporterInstaller failureReporterInstaller;

    int output;
    MockExpectedCallsListForTest expectations;
    mock().expectOneCall("foo").withOutputParameterReturning("output", &output, sizeof(output));

    expectations.addFunction("foo")->withOutputParameterReturning("output", &output, sizeof(output));
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}